

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::applyParams
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandedDecl *this,Array<capnp::compiler::NodeTranslator::BrandedDecl> *params,
          Reader subSource)

{
  Reader source;
  bool bVar1;
  BrandScope *params_00;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *other;
  anon_class_16_2_4e2af6e8 local_98;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  void *local_78;
  WirePointer *pWStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_48;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *local_20;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *params_local;
  BrandedDecl *this_local;
  
  local_20 = params;
  params_local = (Array<capnp::compiler::NodeTranslator::BrandedDecl> *)this;
  this_local = (BrandedDecl *)__return_storage_ptr__;
  bVar1 = kj::
          OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
          ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>(&this->body);
  if (bVar1) {
    kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
              (__return_storage_ptr__,(void *)0x0);
  }
  else {
    params_00 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->(&this->brand);
    other = kj::mv<kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>>(params);
    kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::Array(&local_48,other);
    kj::
    OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
    ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
    source = subSource;
    local_88 = subSource._reader.segment;
    pCStack_80 = subSource._reader.capTable;
    local_78 = subSource._reader.data;
    pWStack_70 = subSource._reader.pointers;
    local_68._0_4_ = subSource._reader.dataSize;
    local_68._4_2_ = subSource._reader.pointerCount;
    local_68._6_2_ = subSource._reader._38_2_;
    subSource._reader._40_8_ = source._reader._40_8_;
    uStack_60._0_4_ = subSource._reader.nestingLimit;
    uStack_60._4_4_ = subSource._reader._44_4_;
    subSource = source;
    BrandScope::setParams
              ((BrandScope *)&stack0xffffffffffffffd0,
               (Array<capnp::compiler::NodeTranslator::BrandedDecl> *)params_00,(Which)&local_48,
               source);
    local_98.this = this;
    local_98.subSource = &subSource;
    kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::
    map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_node_translator_c__:881:14)>
              (__return_storage_ptr__,
               (Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)
               &stack0xffffffffffffffd0,&local_98);
    kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::~Maybe
              ((Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)
               &stack0xffffffffffffffd0);
    kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandedDecl::applyParams(
    kj::Array<BrandedDecl> params, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return nullptr;
  } else {
    return brand->setParams(kj::mv(params), body.get<Resolver::ResolvedDecl>().kind, subSource)
        .map([&](kj::Own<BrandScope>&& scope) {
      BrandedDecl result = *this;
      result.brand = kj::mv(scope);
      result.source = subSource;
      return result;
    });
  }
}